

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O3

void __thiscall CGameClient::ProcessEvents(CGameClient *this)

{
  vec2 Pos;
  uint uVar1;
  int iVar2;
  CNetEvent_Explosion *ev;
  undefined4 extraout_var;
  uint uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  vec2 Pos_00;
  vec2 Pos_01;
  vec2 Pos_02;
  vec2 Pos_03;
  vec2 Pos_04;
  CSnapItem Item;
  undefined4 local_3c [3];
  long local_30;
  undefined8 *puVar3;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_SuppressEvents == false) {
    uVar5 = 0;
    uVar1 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x1e])(this->m_pClient,0);
    if (0 < (int)uVar1) {
      do {
        iVar2 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x20])
                          (this->m_pClient,0,uVar5,local_3c);
        puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar2);
        switch(local_3c[0]) {
        case 0x11:
          Pos_00.field_0.x = (float)(int)*puVar3;
          Pos_00.field_1.y = (float)(int)((ulong)*puVar3 >> 0x20);
          CEffects::Explosion(this->m_pEffects,Pos_00);
          break;
        case 0x12:
          Pos_03.field_0.x = (float)(int)*puVar3;
          Pos_03.field_1.y = (float)(int)((ulong)*puVar3 >> 0x20);
          CEffects::PlayerSpawn(this->m_pEffects,Pos_03);
          break;
        case 0x13:
          Pos_01.field_0.x = (float)(int)*puVar3;
          Pos_01.field_1.y = (float)(int)((ulong)*puVar3 >> 0x20);
          CEffects::HammerHit(this->m_pEffects,Pos_01);
          break;
        case 0x14:
          Pos_02.field_0.x = (float)(int)*puVar3;
          Pos_02.field_1.y = (float)(int)((ulong)*puVar3 >> 0x20);
          CEffects::PlayerDeath(this->m_pEffects,Pos_02,*(int *)(puVar3 + 1));
          break;
        case 0x15:
          Pos.field_1.y = (float)(int)((ulong)*puVar3 >> 0x20);
          Pos.field_0.x = (float)(int)*puVar3;
          CSounds::PlayAt(this->m_pSounds,2,*(int *)(puVar3 + 1),1.0,Pos);
          break;
        case 0x16:
          Pos_04.field_0.x = (float)(int)*puVar3;
          Pos_04.field_1.y = (float)(int)((ulong)*puVar3 >> 0x20);
          CEffects::DamageIndicator
                    (this->m_pEffects,Pos_04,*(int *)((long)puVar3 + 0x14) + *(int *)(puVar3 + 2),
                     (float)*(int *)((long)puVar3 + 0xc) * 0.00390625,*(int *)(puVar3 + 1));
        }
        uVar4 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar4;
      } while (uVar1 != uVar4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameClient::ProcessEvents()
{
	if(m_SuppressEvents)
		return;

	int SnapType = IClient::SNAP_CURRENT;
	int Num = Client()->SnapNumItems(SnapType);
	for(int Index = 0; Index < Num; Index++)
	{
		IClient::CSnapItem Item;
		const void *pData = Client()->SnapGetItem(SnapType, Index, &Item);

		if(Item.m_Type == NETEVENTTYPE_DAMAGE)
		{
			CNetEvent_Damage *ev = (CNetEvent_Damage *)pData;
			m_pEffects->DamageIndicator(vec2(ev->m_X, ev->m_Y), ev->m_HealthAmount + ev->m_ArmorAmount, ev->m_Angle / 256.0f, ev->m_ClientID);
		}
		else if(Item.m_Type == NETEVENTTYPE_EXPLOSION)
		{
			CNetEvent_Explosion *ev = (CNetEvent_Explosion *)pData;
			m_pEffects->Explosion(vec2(ev->m_X, ev->m_Y));
		}
		else if(Item.m_Type == NETEVENTTYPE_HAMMERHIT)
		{
			CNetEvent_HammerHit *ev = (CNetEvent_HammerHit *)pData;
			m_pEffects->HammerHit(vec2(ev->m_X, ev->m_Y));
		}
		else if(Item.m_Type == NETEVENTTYPE_SPAWN)
		{
			CNetEvent_Spawn *ev = (CNetEvent_Spawn *)pData;
			m_pEffects->PlayerSpawn(vec2(ev->m_X, ev->m_Y));
		}
		else if(Item.m_Type == NETEVENTTYPE_DEATH)
		{
			CNetEvent_Death *ev = (CNetEvent_Death *)pData;
			m_pEffects->PlayerDeath(vec2(ev->m_X, ev->m_Y), ev->m_ClientID);
		}
		else if(Item.m_Type == NETEVENTTYPE_SOUNDWORLD)
		{
			CNetEvent_SoundWorld *ev = (CNetEvent_SoundWorld *)pData;
			m_pSounds->PlayAt(CSounds::CHN_WORLD, ev->m_SoundID, 1.0f, vec2(ev->m_X, ev->m_Y));
		}
	}
}